

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bgpsec.c
# Opt level: O0

spki_record * create_record(int ASN,uint8_t *ski,uint8_t *spki)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  spki_record *psVar18;
  long in_FS_OFFSET;
  spki_record *record;
  uint8_t *spki_local;
  uint8_t *ski_local;
  int ASN_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar18 = (spki_record *)malloc(0x80);
  *(undefined8 *)(psVar18->spki + 0x58) = 0;
  psVar18->socket = (rtr_socket *)0x0;
  psVar18->spki[0x48] = '\0';
  psVar18->spki[0x49] = '\0';
  psVar18->spki[0x4a] = '\0';
  psVar18->spki[0x4b] = '\0';
  psVar18->spki[0x4c] = '\0';
  psVar18->spki[0x4d] = '\0';
  psVar18->spki[0x4e] = '\0';
  psVar18->spki[0x4f] = '\0';
  psVar18->spki[0x50] = '\0';
  psVar18->spki[0x51] = '\0';
  psVar18->spki[0x52] = '\0';
  psVar18->spki[0x53] = '\0';
  psVar18->spki[0x54] = '\0';
  psVar18->spki[0x55] = '\0';
  psVar18->spki[0x56] = '\0';
  psVar18->spki[0x57] = '\0';
  psVar18->spki[0x38] = '\0';
  psVar18->spki[0x39] = '\0';
  psVar18->spki[0x3a] = '\0';
  psVar18->spki[0x3b] = '\0';
  psVar18->spki[0x3c] = '\0';
  psVar18->spki[0x3d] = '\0';
  psVar18->spki[0x3e] = '\0';
  psVar18->spki[0x3f] = '\0';
  psVar18->spki[0x40] = '\0';
  psVar18->spki[0x41] = '\0';
  psVar18->spki[0x42] = '\0';
  psVar18->spki[0x43] = '\0';
  psVar18->spki[0x44] = '\0';
  psVar18->spki[0x45] = '\0';
  psVar18->spki[0x46] = '\0';
  psVar18->spki[0x47] = '\0';
  psVar18->spki[0x28] = '\0';
  psVar18->spki[0x29] = '\0';
  psVar18->spki[0x2a] = '\0';
  psVar18->spki[0x2b] = '\0';
  psVar18->spki[0x2c] = '\0';
  psVar18->spki[0x2d] = '\0';
  psVar18->spki[0x2e] = '\0';
  psVar18->spki[0x2f] = '\0';
  psVar18->spki[0x30] = '\0';
  psVar18->spki[0x31] = '\0';
  psVar18->spki[0x32] = '\0';
  psVar18->spki[0x33] = '\0';
  psVar18->spki[0x34] = '\0';
  psVar18->spki[0x35] = '\0';
  psVar18->spki[0x36] = '\0';
  psVar18->spki[0x37] = '\0';
  psVar18->spki[0x18] = '\0';
  psVar18->spki[0x19] = '\0';
  psVar18->spki[0x1a] = '\0';
  psVar18->spki[0x1b] = '\0';
  psVar18->spki[0x1c] = '\0';
  psVar18->spki[0x1d] = '\0';
  psVar18->spki[0x1e] = '\0';
  psVar18->spki[0x1f] = '\0';
  psVar18->spki[0x20] = '\0';
  psVar18->spki[0x21] = '\0';
  psVar18->spki[0x22] = '\0';
  psVar18->spki[0x23] = '\0';
  psVar18->spki[0x24] = '\0';
  psVar18->spki[0x25] = '\0';
  psVar18->spki[0x26] = '\0';
  psVar18->spki[0x27] = '\0';
  psVar18->spki[8] = '\0';
  psVar18->spki[9] = '\0';
  psVar18->spki[10] = '\0';
  psVar18->spki[0xb] = '\0';
  psVar18->spki[0xc] = '\0';
  psVar18->spki[0xd] = '\0';
  psVar18->spki[0xe] = '\0';
  psVar18->spki[0xf] = '\0';
  psVar18->spki[0x10] = '\0';
  psVar18->spki[0x11] = '\0';
  psVar18->spki[0x12] = '\0';
  psVar18->spki[0x13] = '\0';
  psVar18->spki[0x14] = '\0';
  psVar18->spki[0x15] = '\0';
  psVar18->spki[0x16] = '\0';
  psVar18->spki[0x17] = '\0';
  *(undefined8 *)(psVar18->ski + 0x10) = 0;
  psVar18->spki[0] = '\0';
  psVar18->spki[1] = '\0';
  psVar18->spki[2] = '\0';
  psVar18->spki[3] = '\0';
  psVar18->spki[4] = '\0';
  psVar18->spki[5] = '\0';
  psVar18->spki[6] = '\0';
  psVar18->spki[7] = '\0';
  psVar18->ski[0] = '\0';
  psVar18->ski[1] = '\0';
  psVar18->ski[2] = '\0';
  psVar18->ski[3] = '\0';
  psVar18->ski[4] = '\0';
  psVar18->ski[5] = '\0';
  psVar18->ski[6] = '\0';
  psVar18->ski[7] = '\0';
  psVar18->ski[8] = '\0';
  psVar18->ski[9] = '\0';
  psVar18->ski[10] = '\0';
  psVar18->ski[0xb] = '\0';
  psVar18->ski[0xc] = '\0';
  psVar18->ski[0xd] = '\0';
  psVar18->ski[0xe] = '\0';
  psVar18->ski[0xf] = '\0';
  psVar18->asn = ASN;
  *(undefined4 *)(psVar18->ski + 0x10) = *(undefined4 *)(ski + 0x10);
  uVar17 = *(undefined8 *)(ski + 8);
  *(undefined8 *)psVar18->ski = *(undefined8 *)ski;
  *(undefined8 *)(psVar18->ski + 8) = uVar17;
  uVar17 = *(undefined8 *)(spki + 0x53);
  *(undefined8 *)(psVar18->spki + 0x4b) = *(undefined8 *)(spki + 0x4b);
  *(undefined8 *)(psVar18->spki + 0x53) = uVar17;
  uVar17 = *(undefined8 *)(spki + 0x48);
  *(undefined8 *)(psVar18->spki + 0x40) = *(undefined8 *)(spki + 0x40);
  *(undefined8 *)(psVar18->spki + 0x48) = uVar17;
  uVar2 = *(undefined4 *)spki;
  uVar3 = *(undefined4 *)(spki + 4);
  uVar4 = *(undefined4 *)(spki + 8);
  uVar5 = *(undefined4 *)(spki + 0xc);
  uVar6 = *(undefined4 *)(spki + 0x10);
  uVar7 = *(undefined4 *)(spki + 0x14);
  uVar8 = *(undefined4 *)(spki + 0x18);
  uVar9 = *(undefined4 *)(spki + 0x1c);
  uVar10 = *(undefined4 *)(spki + 0x20);
  uVar11 = *(undefined4 *)(spki + 0x24);
  uVar12 = *(undefined4 *)(spki + 0x28);
  uVar13 = *(undefined4 *)(spki + 0x2c);
  uVar14 = *(undefined4 *)(spki + 0x34);
  uVar15 = *(undefined4 *)(spki + 0x38);
  uVar16 = *(undefined4 *)(spki + 0x3c);
  *(undefined4 *)(psVar18->spki + 0x30) = *(undefined4 *)(spki + 0x30);
  *(undefined4 *)(psVar18->spki + 0x34) = uVar14;
  *(undefined4 *)(psVar18->spki + 0x38) = uVar15;
  *(undefined4 *)(psVar18->spki + 0x3c) = uVar16;
  *(undefined4 *)(psVar18->spki + 0x20) = uVar10;
  *(undefined4 *)(psVar18->spki + 0x24) = uVar11;
  *(undefined4 *)(psVar18->spki + 0x28) = uVar12;
  *(undefined4 *)(psVar18->spki + 0x2c) = uVar13;
  *(undefined4 *)(psVar18->spki + 0x10) = uVar6;
  *(undefined4 *)(psVar18->spki + 0x14) = uVar7;
  *(undefined4 *)(psVar18->spki + 0x18) = uVar8;
  *(undefined4 *)(psVar18->spki + 0x1c) = uVar9;
  *(undefined4 *)psVar18->spki = uVar2;
  *(undefined4 *)(psVar18->spki + 4) = uVar3;
  *(undefined4 *)(psVar18->spki + 8) = uVar4;
  *(undefined4 *)(psVar18->spki + 0xc) = uVar5;
  psVar18->socket = (rtr_socket *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return psVar18;
  }
  __stack_chk_fail();
}

Assistant:

static struct spki_record *create_record(int ASN, uint8_t *ski, uint8_t *spki)
{
	struct spki_record *record = malloc(sizeof(struct spki_record));

	memset(record, 0, sizeof(*record));
	record->asn = ASN;
	memcpy(record->ski, ski, SKI_SIZE);
	memcpy(record->spki, spki, SPKI_SIZE);
	record->socket = NULL;
	return record;
}